

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O3

HRESULT utf8::NarrowStringToWide<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCSTR sourceString,size_t sourceCount,
                  LPWSTR *destStringPtr,charcount_t *destCount,size_t *allocateCount)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  LPWSTR pWVar4;
  ulong uVar5;
  undefined4 *puVar6;
  long lVar7;
  uint uVar8;
  
  uVar5 = sourceCount * 2 + 2;
  if (uVar5 < sourceCount) {
    return -0x7ff8fff2;
  }
  pWVar4 = (LPWSTR)(*allocator)(uVar5);
  if (pWVar4 == (LPWSTR)0x0) {
    return -0x7ff8fff2;
  }
  if (allocateCount != (size_t *)0x0) {
    *allocateCount = uVar5;
  }
  *destStringPtr = pWVar4;
  if (0xfffffffe < sourceCount) {
    *pWVar4 = L'\0';
    return -0x7ff8fff2;
  }
  if (sourceCount == 0) {
    lVar7 = 0;
LAB_0039de30:
    if (sourceCount - lVar7 != 0) {
      cVar3 = ByteIndexIntoCharacterIndex
                        ((LPCUTF8)(sourceString + lVar7),sourceCount - lVar7,doDefault);
      uVar8 = (int)lVar7 + cVar3;
      if (sourceCount < uVar8) {
        return -0x7ff8fff2;
      }
      DecodeUnitsIntoAndNullTerminateNoAdvance
                (pWVar4 + lVar7,(LPCUTF8)(sourceString + lVar7),
                 (LPCUTF8)(sourceString + sourceCount),doAllowInvalidWCHARs,(bool *)0x0);
      *destCount = uVar8;
      if (pWVar4[uVar8] == L'\0') {
        return 0;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                         ,0xaa,"(destString[*destCount] == 0)","destString[*destCount] == 0");
      if (bVar2) {
        *puVar6 = 0;
        return 0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    uVar5 = 0;
    do {
      if (sourceString[uVar5] < '\x01') {
        lVar7 = 0;
        if (2 < uVar5) {
          lVar7 = uVar5 - 3;
        }
        goto LAB_0039de30;
      }
      pWVar4[uVar5] = (short)sourceString[uVar5];
      uVar5 = uVar5 + 1;
    } while (sourceCount != uVar5);
  }
  *destCount = (charcount_t)sourceCount;
  pWVar4[sourceCount] = L'\0';
  return 0;
}

Assistant:

HRESULT NarrowStringToWide(_In_ AllocatorFunction allocator,_In_ LPCSTR sourceString,
        size_t sourceCount, _Out_ LPWSTR* destStringPtr, _Out_ charcount_t* destCount, size_t* allocateCount = nullptr)
    {
        size_t cbDestString = (sourceCount + 1) * sizeof(WCHAR);
        if (cbDestString < sourceCount) // overflow ?
        {
            return E_OUTOFMEMORY;
        }

        WCHAR* destString = (WCHAR*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        if (allocateCount != nullptr)
        {
            *allocateCount = cbDestString;
        }

        *destStringPtr = destString;
        return NarrowStringToWideNoAlloc(sourceString, sourceCount, destString, sourceCount + 1, destCount);
    }